

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineRendering
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  byte bVar1;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *this_00;
  Pipeline *this_01;
  ProgramPipeline *this_02;
  ProgramWrapper *pPVar2;
  TestLog *this_03;
  MessageBuilder *pMVar3;
  TestLog *this_04;
  TestLog *log;
  SeparateShaderTest *pSVar4;
  double __x;
  double __x_00;
  undefined8 in_stack_fffffffffffffb68;
  ResultCollector *this_05;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  allocator<char> local_3f9;
  string local_3f8;
  undefined1 local_3d1;
  undefined1 local_3d0 [7];
  bool result;
  MessageBuilder local_250;
  deUint32 local_cc;
  undefined1 local_c8 [4];
  GLuint drawSeed;
  Surface pipelineSurface;
  Surface refSurface;
  undefined1 local_90 [4];
  GLuint refProgName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_80;
  undefined1 local_70 [8];
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  refProgram;
  GLuint pipeName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  local_50;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *local_40;
  Pipeline *local_30;
  Pipeline *pipeline;
  ProgramParams pp;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *pipeOut_local;
  SeparateShaderTest *this_local;
  
  pp._8_8_ = pipeOut;
  _pipeline = genProgramParams(&this->m_rnd);
  pSVar4 = this;
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_50,this,(ProgramParams *)&pipeline);
  local_40 = de::details::MovePtr::operator_cast_to_PtrData(&local_50,(MovePtr *)pSVar4);
  data._8_7_ = in_stack_fffffffffffffb70;
  data.ptr = (Pipeline *)in_stack_fffffffffffffb68;
  data._15_1_ = in_stack_fffffffffffffb77;
  this_00 = &de::details::
             MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
             ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                          *)pp._8_8_,data)->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ;
  this_01 = de::details::
            UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
            ::operator*(this_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
              *)&local_50);
  local_30 = this_01;
  this_02 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
            ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                          *)this_01);
  refProgram.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data._8_4_ = glu::ProgramPipeline::getPipeline(this_02);
  pSVar4 = this;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_90,this,(ProgramParams *)&pipeline);
  local_80 = de::details::MovePtr::operator_cast_to_PtrData
                       ((PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_90,(MovePtr *)pSVar4);
  data_00._8_7_ = in_stack_fffffffffffffb70;
  data_00.ptr = (ProgramWrapper *)in_stack_fffffffffffffb68;
  data_00._15_1_ = in_stack_fffffffffffffb77;
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               *)local_70,data_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_90);
  pPVar2 = de::details::
           UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_70);
  refSurface.m_pixels.m_cap._4_4_ = (*pPVar2->_vptr_ProgramWrapper[2])();
  tcu::Surface::Surface((Surface *)&pipelineSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_c8);
  local_cc = de::Random::getUint32(&this->m_rnd);
  glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,refSurface.m_pixels.m_cap._4_4_);
  SeparateShaderTest::log(this,__x);
  tcu::TestLog::operator<<(&local_250,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_250,(char (*) [16])"// Use program ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&refSurface.m_pixels.m_cap + 4));
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_250);
  drawSurface(this,(Surface *)&pipelineSurface.m_pixels.m_cap,local_cc);
  glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,0);
  glu::CallLogWrapper::glBindProgramPipeline
            (&this->super_CallLogWrapper,
             refProgram.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data._8_4_);
  SeparateShaderTest::log(this,__x_00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_3d0,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_3d0,(char (*) [18])"// Bind pipeline ");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(uint *)&refProgram.
                                      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                                      .m_data.field_0x8);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3d0);
  drawSurface(this,(Surface *)local_c8,local_cc);
  glu::CallLogWrapper::glBindProgramPipeline(&this->super_CallLogWrapper,0);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = tcu::fuzzyCompare(log,"Program pipeline result",
                            "Result of comparing a program pipeline with a monolithic program",
                            (Surface *)&pipelineSurface.m_pixels.m_cap,(Surface *)local_c8,0.05,
                            COMPARE_LOG_RESULT);
  this_05 = &this->m_status;
  local_3d1 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"Pipeline rendering differs from equivalent monolithic program",
             &local_3f9);
  tcu::ResultCollector::check(this_05,(bool)(bVar1 & 1),&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  tcu::Surface::~Surface((Surface *)local_c8);
  tcu::Surface::~Surface((Surface *)&pipelineSurface.m_pixels.m_cap);
  de::details::
  UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniquePtr((UniquePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_70);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineRendering (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pp			= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	UniquePtr<ProgramWrapper>	refProgram	(createReferenceProgram(pp));
	GLuint						refProgName	= refProgram->getProgramName();
	Surface						refSurface;
	Surface						pipelineSurface;
	GLuint						drawSeed	= m_rnd.getUint32();

	glUseProgram(refProgName);
	log() << TestLog::Message << "// Use program " << refProgName << TestLog::EndMessage;
	drawSurface(refSurface, drawSeed);
	glUseProgram(0);

	glBindProgramPipeline(pipeName);
	log() << TestLog::Message << "// Bind pipeline " << pipeName << TestLog::EndMessage;
	drawSurface(pipelineSurface, drawSeed);
	glBindProgramPipeline(0);

	{
		const bool result = tcu::fuzzyCompare(
			m_testCtx.getLog(), "Program pipeline result",
			"Result of comparing a program pipeline with a monolithic program",
			refSurface, pipelineSurface, 0.05f, tcu::COMPARE_LOG_RESULT);

		m_status.check(result, "Pipeline rendering differs from equivalent monolithic program");
	}
}